

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMiter.c
# Opt level: O3

int Abc_NtkMiterIsConstant(Abc_Ntk_t *pMiter)

{
  uint uVar1;
  long *plVar2;
  ulong uVar3;
  Vec_Ptr_t *pVVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  long lVar7;
  
  if (pMiter->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pMiter)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMiter.c"
                  ,0x2ae,"int Abc_NtkMiterIsConstant(Abc_Ntk_t *)");
  }
  pVVar4 = pMiter->vPos;
  if (0 < pVVar4->nSize) {
    lVar7 = 0;
    do {
      plVar2 = (long *)pVVar4->pArray[lVar7];
      uVar3 = *(ulong *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8);
      pAVar6 = (Abc_Obj_t *)(uVar3 & 0xfffffffffffffffe);
      if (pAVar6->pNtk->ntkType != ABC_NTK_STRASH) {
        __assert_fail("Abc_NtkIsStrash(Abc_ObjRegular(pNode)->pNtk)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abc.h"
                      ,0x18e,"int Abc_AigNodeIsConst(Abc_Obj_t *)");
      }
      if ((*(uint *)&pAVar6->field_0x14 & 0xf) != 1) {
        return -1;
      }
      uVar1 = *(uint *)((long)plVar2 + 0x14);
      pAVar5 = Abc_AigConst1(pMiter);
      if (pAVar5 != pAVar6) {
        __assert_fail("Abc_ObjRegular(pChild) == Abc_AigConst1(pMiter)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMiter.c"
                      ,0x2b5,"int Abc_NtkMiterIsConstant(Abc_Ntk_t *)");
      }
      if ((((uint)uVar3 ^ uVar1 >> 10) & 1) == 0) {
        return 0;
      }
      lVar7 = lVar7 + 1;
      pVVar4 = pMiter->vPos;
    } while (lVar7 < pVVar4->nSize);
  }
  return 1;
}

Assistant:

int Abc_NtkMiterIsConstant( Abc_Ntk_t * pMiter )
{
    Abc_Obj_t * pNodePo, * pChild;
    int i;
    assert( Abc_NtkIsStrash(pMiter) );
    Abc_NtkForEachPo( pMiter, pNodePo, i )
    {
        pChild = Abc_ObjChild0( pNodePo );
        // check if the output is constant 1
        if ( Abc_AigNodeIsConst(pChild) )
        {
            assert( Abc_ObjRegular(pChild) == Abc_AigConst1(pMiter) );
            if ( !Abc_ObjIsComplement(pChild) )
            {
                // if the miter is constant 1, return immediately
//                printf( "MITER IS CONSTANT 1!\n" );
                return 0;
            }
        }
/*
        // check if the output is not constant 0
        else if ( Abc_ObjRegular(pChild)->fPhase != (unsigned)Abc_ObjIsComplement(pChild) )
        {
            return 0;
        }
*/
        // if the miter is undecided (or satisfiable), return immediately
        else 
            return -1;
    }
    // return 1, meaning all outputs are constant zero
    return 1;
}